

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O0

bool CompileSourceFile(NscCompiler *Compiler,int CompilerVersion,bool Optimize,bool IgnoreIncludes,
                      bool SuppressDebugSymbols,bool Quiet,bool VerifyCode,IDebugTextOut *TextOut,
                      UINT32 CompilerFlags,ResRef32 InFile,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *InFileContents,
                      string *OutBaseFile)

{
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  reference pvVar5;
  size_type sVar6;
  size_t sVar7;
  undefined8 uVar8;
  byte in_CL;
  byte in_DL;
  byte in_R8B;
  byte in_R9B;
  uint uVar9;
  byte in_stack_00000008;
  Writer *in_stack_00000010;
  uint in_stack_00000018;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000040;
  string *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dep_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dep;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  char filec [256];
  FILE *f;
  string FileName;
  NscResult Result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Dependencies;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Symbols;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Code;
  undefined4 uVar10;
  DispatchAction in_stack_fffffffffffffc5c;
  Writer *this;
  uint uVar11;
  undefined4 in_stack_fffffffffffffc6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Level level;
  Writer *this_01;
  VerboseLevel in_stack_fffffffffffffc90;
  FILE *__stream;
  _Self local_288;
  _Self local_280;
  undefined1 *local_278;
  reference local_270;
  _Self local_268;
  _Self local_260;
  undefined1 *local_258;
  char local_1c8 [26];
  undefined1 in_stack_fffffffffffffe52;
  undefined1 in_stack_fffffffffffffe53;
  int in_stack_fffffffffffffe54;
  size_t in_stack_fffffffffffffe58;
  void *in_stack_fffffffffffffe60;
  ResRef32 *in_stack_fffffffffffffe68;
  NscCompiler *in_stack_fffffffffffffe70;
  IDebugTextOut *in_stack_fffffffffffffe98;
  UINT32 in_stack_fffffffffffffea0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb8;
  string local_b8 [36];
  NscResult local_94;
  undefined1 local_90 [72];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  byte local_11;
  
  local_25 = in_DL & 1;
  local_26 = in_CL & 1;
  local_27 = in_R8B & 1;
  local_28 = in_R9B & 1;
  local_29 = in_stack_00000008 & 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c564b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c5658);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1c5665);
  std::__cxx11::string::string(local_b8);
  strncpy(local_1c8,&stack0x00000020,0x100);
  if ((local_28 & 1) == 0) {
    (**in_stack_00000010->_vptr_Writer)(in_stack_00000010,"Compiling: %s.nss",&stack0x00000020);
  }
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_fffffffffffffc70);
  if (!bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_stack_00000040,0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_00000040);
  this_01 = (Writer *)local_90;
  level = (Level)((ulong)(local_90 + 0x30) >> 0x20);
  this_00 = &local_48;
  uVar9 = local_26 & 1;
  this = in_stack_00000010;
  uVar11 = in_stack_00000018;
  local_94 = NscCompiler::NscCompileScript
                       (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe54,(bool)in_stack_fffffffffffffe53,
                        (bool)in_stack_fffffffffffffe52,in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  if (local_94 == NscResult_Failure) {
    (**in_stack_00000010->_vptr_Writer)(in_stack_00000010,"Compilation aborted with errors.\n");
    local_11 = 0;
  }
  else if (local_94 == NscResult_Success) {
    std::__cxx11::string::operator=(local_b8,in_stack_00000048);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffffc5c,uVar9));
    if (bVar1) {
      (**in_stack_00000010->_vptr_Writer)(in_stack_00000010,"Skipped compiled file generation.\n");
      local_11 = 1;
    }
    else {
      std::__cxx11::string::operator+=(local_b8,".ncs");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pFVar3 = fopen(pcVar2,"wb");
      if (pFVar3 == (FILE *)0x0) {
        uVar10 = 0;
        el::base::Writer::Writer
                  (this_01,level,(char *)this_00,CONCAT44(in_stack_fffffffffffffc6c,uVar11),
                   (char *)this,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc90);
        el::base::Writer::construct
                  ((Writer *)&stack0xfffffffffffffdb0,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<(this,(char (*) [14])CONCAT44(in_stack_fffffffffffffc5c,uVar10))
        ;
        __errno_location();
        el::base::Writer::operator<<(this,(int *)CONCAT44(in_stack_fffffffffffffc5c,uVar10));
        el::base::Writer::~Writer(this);
        uVar4 = std::__cxx11::string::c_str();
        (**in_stack_00000010->_vptr_Writer)
                  (in_stack_00000010,"Error: Unable to open output file %s.\n",uVar4);
        local_11 = 0;
      }
      else {
        bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(this_00);
        if (!bVar1) {
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_48,0);
          sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
          sVar7 = fwrite(pvVar5,sVar6,1,pFVar3);
          if (sVar7 != 1) {
            fclose(pFVar3);
            uVar4 = std::__cxx11::string::c_str();
            (**in_stack_00000010->_vptr_Writer)
                      (in_stack_00000010,"Error: Failed to write to output file %s.\n",uVar4);
            local_11 = 0;
            goto LAB_001c5fd8;
          }
        }
        fclose(pFVar3);
        if ((local_27 & 1) == 0) {
          std::__cxx11::string::operator=(local_b8,in_stack_00000048);
          std::__cxx11::string::operator+=(local_b8,".ndb");
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pFVar3 = fopen(pcVar2,"wb");
          if (pFVar3 == (FILE *)0x0) {
            uVar4 = std::__cxx11::string::c_str();
            (**in_stack_00000010->_vptr_Writer)
                      (in_stack_00000010,"Error: Failed to open debug symbols file %s.\n",uVar4);
            local_11 = 0;
            goto LAB_001c5fd8;
          }
          bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(this_00);
          if (!bVar1) {
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (local_90 + 0x30),0);
            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               (local_90 + 0x30));
            sVar7 = fwrite(pvVar5,sVar6,1,pFVar3);
            if (sVar7 != 1) {
              fclose(pFVar3);
              uVar4 = std::__cxx11::string::c_str();
              (**in_stack_00000010->_vptr_Writer)
                        (in_stack_00000010,"Error: Failed to write to debug symbols file %s.\n",
                         uVar4);
              local_11 = 0;
              goto LAB_001c5fd8;
            }
          }
          fclose(pFVar3);
        }
        if ((in_stack_00000018 & 0x10) != 0) {
          std::__cxx11::string::operator=(local_b8,in_stack_00000048);
          std::__cxx11::string::operator+=(local_b8,".d");
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pFVar3 = fopen(pcVar2,"w");
          if (pFVar3 == (FILE *)0x0) {
            uVar4 = std::__cxx11::string::c_str();
            (**in_stack_00000010->_vptr_Writer)
                      (in_stack_00000010,"Error: Failed to open dependency file %s.\n",uVar4);
            local_11 = 0;
            goto LAB_001c5fd8;
          }
          bVar1 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1c5e11);
          if (!bVar1) {
            uVar4 = std::__cxx11::string::c_str();
            uVar8 = std::__cxx11::string::c_str();
            fprintf(pFVar3,"%s.ncs: %s.nss ",uVar4,uVar8);
            local_258 = local_90;
            local_260._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc5c,uVar9));
            local_268._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc5c,uVar9));
            while (bVar1 = std::operator!=(&local_260,&local_268), bVar1) {
              local_270 = std::
                          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)this);
              uVar4 = std::__cxx11::string::c_str();
              fprintf(pFVar3," \\\n    %s",uVar4);
              std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this);
            }
            local_278 = local_90;
            local_280._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc5c,uVar9));
            local_288._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc5c,uVar9));
            while (bVar1 = std::operator!=(&local_280,&local_288), bVar1) {
              std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this);
              __stream = pFVar3;
              uVar4 = std::__cxx11::string::c_str();
              fprintf(__stream,"\n%s:\n",uVar4);
              std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this);
            }
          }
          fclose(pFVar3);
        }
        local_11 = 1;
      }
    }
  }
  else if (local_94 == NscResult_Include) {
    if (((local_28 & 1) == 0) && ((local_26 & 1) != 0)) {
      (**in_stack_00000010->_vptr_Writer)
                (in_stack_00000010,"%s.nss is an include file, ignored.",&stack0x00000020);
    }
    local_11 = 1;
  }
  else {
    (**in_stack_00000010->_vptr_Writer)(in_stack_00000010,"Unknown compiler status code.\n");
    local_11 = 0;
  }
LAB_001c5fd8:
  std::__cxx11::string::~string(local_b8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1c5ff2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return (bool)(local_11 & 1);
}

Assistant:

bool
CompileSourceFile(
        NscCompiler &Compiler,
        int CompilerVersion,
        bool Optimize,
        bool IgnoreIncludes,
        bool SuppressDebugSymbols,
        bool Quiet,
        bool VerifyCode,
        IDebugTextOut *TextOut,
        UINT32 CompilerFlags,
        const NWN::ResRef32 InFile,
        const std::vector<unsigned char> &InFileContents,
        const std::string &OutBaseFile
)
/*++

Routine Description:

	This routine compiles a single source file according to the specified set of
	compilation options.

Arguments:

	NscCompiler - Supplies the compiler context that will be used to process the
	              request.

	CompilerVersion - Supplies the BioWare-compatible compiler version number.

	Optimize - Supplies a Boolean value indicating true if the script should be
	           optimized.

	IgnoreIncludes - Supplies a Boolean value indicating true if include-only
	                 source files should be ignored.

	SuppressDebugSymbols - Supplies a Boolean value indicating true if debug
	                       symbol generation should be suppressed.

	Quiet - Supplies a Boolean value that indicates true if non-critical
	        messages should be silenced.

	VerifyCode - Supplies a Boolean value that indicates true if generated code
	             is to be verified with the analyzer/verifier if compilation was
	             successful.

	TextOut - Supplies the text out interface used to receive any diagnostics
	          issued.

	CompilerFlags - Supplies compiler control flags.  Legal values are drawn
	                from the NscCompilerFlags enumeration.

	InFile - Supplies the RESREF corresponding to the input file name.

	InFileContents - Supplies the contents of the input file.

	OutBaseFile - Supplies the base name (potentially including path) of the
	              output file.  No extension is present.

Return Value:

	The routine returns a Boolean value indicating true on success, else false
	on failure.

	On catastrophic failure, an std::exception is raised.

Environment:

	User mode.

--*/
{
    std::vector<unsigned char> Code;
    std::vector<unsigned char> Symbols;
    std::set<std::string> Dependencies;
    NscResult Result;
    std::string FileName;
    FILE *f;

    char filec[_MAX_FNAME];

    strncpy(filec, InFile.RefStr, _MAX_FNAME);

    if (!Quiet) {
        TextOut->WriteText("Compiling: %s.nss", InFile.RefStr);
    }

    //
    // Execute the main compilation pass.
    //

    Result = Compiler.NscCompileScript(
            InFile,
            (!InFileContents.empty()) ? &InFileContents[0] : nullptr,
            InFileContents.size(),
            CompilerVersion,
            Optimize,
            IgnoreIncludes,
            TextOut,
            CompilerFlags,
            Code,
            Symbols,
            Dependencies);

    switch (Result) {

        case NscResult_Failure:
            TextOut->WriteText(
                    "Compilation aborted with errors.\n");

            return false;

        case NscResult_Include:
            if (!Quiet && IgnoreIncludes) {
                TextOut->WriteText(
                        "%s.nss is an include file, ignored.",
                        InFile.RefStr);
            }

            return true;

        case NscResult_Success:
            break;

        default:
            TextOut->WriteText(
                    "Unknown compiler status code.\n");

            return false;

    }

    //
    // If we compiled successfully, write the results to disk.
    //

    FileName = OutBaseFile;

    if (FileName == "SKIP_OUTPUT") {
        TextOut->WriteText(
                "Skipped compiled file generation.\n");
        return true;
    }

    FileName += ".ncs";
    f = fopen(FileName.c_str(), "wb");

    if (f == nullptr) {
        LOG(DEBUG) << "Error Number " << errno;
        TextOut->WriteText(
                "Error: Unable to open output file %s.\n",
                FileName.c_str());

        return false;
    }

    if (!Code.empty()) {
        if (fwrite(&Code[0], Code.size(), 1, f) != 1) {
            fclose(f);

            TextOut->WriteText(
                    "Error: Failed to write to output file %s.\n",
                    FileName.c_str());

            return false;
        }
    }

    fclose(f);

    if (!SuppressDebugSymbols) {
        FileName = OutBaseFile;
        FileName += ".ndb";

        f = fopen(FileName.c_str(), "wb");

        if (f == nullptr) {
            TextOut->WriteText(
                    "Error: Failed to open debug symbols file %s.\n",
                    FileName.c_str());

            return false;
        }

        if (!Symbols.empty()) {
            if (fwrite(&Symbols[0], Symbols.size(), 1, f) != 1) {
                fclose(f);

                TextOut->WriteText(
                        "Error: Failed to write to debug symbols file %s.\n",
                        FileName.c_str());

                return false;
            }
        }

        fclose(f);
    }

    if (CompilerFlags & NscCompilerFlag_GenerateMakeDeps) {
        FileName = OutBaseFile;
        FileName += ".d";

        f = fopen(FileName.c_str(), "w");

        if (f == nullptr) {
            TextOut->WriteText(
                    "Error: Failed to open dependency file %s.\n",
                    FileName.c_str());

            return false;
        }

        if (!Dependencies.empty()) {
            // NCS primarily depends on the NSS
            fprintf(f, "%s.ncs: %s.nss ", OutBaseFile.c_str(), OutBaseFile.c_str());

            // Print all other dependencies
            for (auto& dep : Dependencies)
                fprintf(f, " \\\n    %s", dep.c_str());

            // Create phony rules for dependencies, so deleting them doesn't
            // require deleting all .d files as well.
            for (auto& dep : Dependencies)
                fprintf(f, "\n%s:\n", dep.c_str());
        }

        fclose(f);
    }
    return true;
}